

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O2

vector<unsigned_long,_true> *
duckdb::ExpressionHeuristics::GetInitialOrder
          (vector<unsigned_long,_true> *__return_storage_ptr__,TableFilterSet *table_filters)

{
  long lVar1;
  type filter;
  idx_t iVar2;
  pointer pFVar3;
  _Rb_tree_node_base *p_Var4;
  __normal_iterator<FilterCost_*,_std::vector<FilterCost,_std::allocator<FilterCost>_>_> __i;
  long lVar5;
  pointer pFVar6;
  pointer pFVar7;
  size_t __n;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  vector<FilterCost,_true> filter_costs;
  
  filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
  super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
  super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
  super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var4 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar7 = (pointer)0x0;
  iVar9 = 0;
  do {
    pFVar3 = filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
             super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((_Rb_tree_header *)p_Var4 == &(table_filters->filters)._M_t._M_impl.super__Rb_tree_header) {
      uVar11 = (long)pFVar7 -
               (long)filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                     super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
      lVar5 = (long)pFVar7 -
              (long)filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                    super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (pFVar7 != filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                    super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        lVar1 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                   super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                   super__Vector_impl_data._M_start,pFVar7,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar5 < 0x101) {
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pFVar3,pFVar7);
        }
        else {
          pFVar6 = pFVar3 + 0x10;
          ::std::
          __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pFVar3,pFVar6);
          for (; pFVar6 != pFVar7; pFVar6 = pFVar6 + 1) {
            ::std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost*,std::vector<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost,std::allocator<duckdb::ExpressionHeuristics::GetInitialOrder(duckdb::TableFilterSet_const&)::FilterCost>>>,__gnu_cxx::__ops::_Val_less_iter>
                      (pFVar6);
          }
        }
      }
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&__return_storage_ptr__->
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&pFVar3->index);
        pFVar3 = pFVar3 + 1;
      }
      ::std::vector<FilterCost,_std::allocator<FilterCost>_>::~vector
                (&filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>);
      return __return_storage_ptr__;
    }
    filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&p_Var4[1]._M_parent);
    iVar2 = Cost(filter);
    pFVar7 = filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
             super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
        super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
        super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      __n = (long)filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                  super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
                  super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (__n == 0x7ffffffffffffff0) {
        ::std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)__n >> 4;
      uVar11 = uVar8;
      if (filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
          super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
          super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 1;
      }
      uVar10 = uVar11 + uVar8;
      if (0x7fffffffffffffe < uVar10) {
        uVar10 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar11,uVar8)) {
        uVar10 = 0x7ffffffffffffff;
      }
      if (uVar10 == 0) {
        pFVar3 = (pointer)0x0;
      }
      else {
        pFVar3 = (pointer)operator_new(uVar10 << 4);
      }
      pFVar3[uVar8].index = iVar9;
      pFVar3[uVar8].cost = iVar2;
      if (0 < (long)__n) {
        memmove(pFVar3,pFVar7,__n);
      }
      if (pFVar7 != (pointer)0x0) {
        operator_delete(pFVar7);
      }
      filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
      super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((long)pFVar3 + __n);
      filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
      super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pFVar3 + uVar10;
      filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
      super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
      _M_start = pFVar3;
    }
    else {
      (filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
       super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
      _M_finish)->index = iVar9;
      (filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
       super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
      _M_finish)->cost = iVar2;
    }
    pFVar7 = filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
             super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
    iVar9 = iVar9 + 1;
    filter_costs.super_vector<FilterCost,_std::allocator<FilterCost>_>.
    super__Vector_base<FilterCost,_std::allocator<FilterCost>_>._M_impl.super__Vector_impl_data.
    _M_finish = pFVar7;
    p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

vector<idx_t> ExpressionHeuristics::GetInitialOrder(const TableFilterSet &table_filters) {
	struct FilterCost {
		idx_t index;
		idx_t cost;

		bool operator==(const FilterCost &p) const {
			return cost == p.cost;
		}
		bool operator<(const FilterCost &p) const {
			return cost < p.cost;
		}
	};
	vector<FilterCost> filter_costs;
	idx_t filter_index = 0;
	for (auto &entry : table_filters.filters) {
		FilterCost cost;
		cost.index = filter_index;
		cost.cost = Cost(*entry.second);
		filter_costs.push_back(cost);
		filter_index++;
	}
	// sort by cost and put back in place
	sort(filter_costs.begin(), filter_costs.end());
	vector<idx_t> initial_permutation;
	for (idx_t i = 0; i < filter_costs.size(); i++) {
		initial_permutation.push_back(filter_costs[i].index);
	}
	return initial_permutation;
}